

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

int preparetocall(lua_State *L,TValue *func,TValue *err)

{
  ushort uVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  int in_EAX;
  
  pTVar2 = L->top;
  pGVar3 = (func->value_).gc;
  (pTVar2->value_).gc = pGVar3;
  uVar1 = func->tt_;
  pTVar2->tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
      ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                  ,0x6e,"int preparetocall(lua_State *, TValue *, TValue *)");
  }
  if (err == (TValue *)0x0) {
    pTVar2[1].tt_ = 0;
  }
  else {
    pGVar3 = (err->value_).gc;
    pTVar2[1].value_.gc = pGVar3;
    uVar1 = err->tt_;
    pTVar2[1].tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                    ,0x70,"int preparetocall(lua_State *, TValue *, TValue *)");
    }
  }
  L->top = pTVar2 + 2;
  return in_EAX;
}

Assistant:

static int preparetocall(lua_State *L, TValue *func, TValue *err) {
  StkId top = L->top;
  setobj2s(L, top, func);  /* will call deferred function */
  if (err) {
    setobj2s(L, top + 1, err); /* and error msg. as 1st argument */
  }
  else {
    setnilvalue(top + 1);
  }
  L->top = top + 2;  /* add function and arguments */
  return 1;
}